

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O3

void __thiscall AllRgbWidget::onUpdateFromAlgorithm(AllRgbWidget *this,QImage *allRgb)

{
  undefined8 uVar1;
  QRect local_48;
  undefined8 local_38;
  code *local_30 [2];
  undefined8 local_20;
  
  QImage::copy(&local_48);
  QPaintDevice::QPaintDevice((QPaintDevice *)local_30);
  uVar1 = local_38;
  local_30[0] = QImage::QImage;
  local_38 = 0;
  local_20 = *(undefined8 *)&this->field_0xa0;
  *(undefined8 *)&this->field_0xa0 = uVar1;
  QImage::~QImage((QImage *)local_30);
  QImage::~QImage((QImage *)&local_48);
  QWidget::update();
  return;
}

Assistant:

void AllRgbWidget::onUpdateFromAlgorithm(QImage allRgb)
{
    allRgb_ = allRgb.copy();
    update();
}